

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ISXD.cpp
# Opt level: O3

MXFReader * __thiscall
AS_02::ISXD::MXFReader::ReadGenericStreamPartitionPayload
          (MXFReader *this,ui32_t SID,FrameBuffer *frame_buf)

{
  long lVar1;
  char cVar2;
  AESDecContext *in_RCX;
  undefined4 in_register_00000034;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,SID) + 8);
  if (lVar1 != 0) {
    cVar2 = (**(code **)(**(long **)(lVar1 + 0x10) + 0x40))();
    if (cVar2 != '\0') {
      ASDCP::MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>::
      ReadGenericStreamPartitionPayload
                ((TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader> *)this,
                 (ui32_t)*(undefined8 *)(CONCAT44(in_register_00000034,SID) + 8),
                 (FrameBuffer *)((ulong)frame_buf & 0xffffffff),in_RCX,(HMACContext *)0x0);
      return this;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  return this;
}

Assistant:

Result_t
AS_02::ISXD::MXFReader::ReadGenericStreamPartitionPayload(const ui32_t SID, ASDCP::FrameBuffer& frame_buf)
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    {
      return m_Reader->ReadGenericStreamPartitionPayload(SID, frame_buf, 0, 0 /*no encryption*/);
    }

  return RESULT_INIT;
}